

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigDup.c
# Opt level: O0

Aig_Man_t * Aig_ManDupNodes(Aig_Man_t *pMan,Vec_Ptr_t *vArray)

{
  int iVar1;
  Aig_Obj_t **ppNodes;
  Vec_Ptr_t *p;
  char *pcVar2;
  Aig_Obj_t *pAVar3;
  Aig_Obj_t *pAVar4;
  Aig_Obj_t *p1;
  void *pvVar5;
  int local_3c;
  int i;
  Aig_Obj_t *pObj;
  Vec_Ptr_t *vObjs;
  Aig_Man_t *pNew;
  Vec_Ptr_t *vArray_local;
  Aig_Man_t *pMan_local;
  
  iVar1 = Vec_PtrSize(vArray);
  if (iVar1 == 0) {
    pMan_local = (Aig_Man_t *)0x0;
  }
  else {
    ppNodes = (Aig_Obj_t **)Vec_PtrArray(vArray);
    iVar1 = Vec_PtrSize(vArray);
    p = Aig_ManDfsNodes(pMan,ppNodes,iVar1);
    pMan_local = Aig_ManStart(10000);
    pcVar2 = Abc_UtilStrsav(pMan->pName);
    pMan_local->pName = pcVar2;
    pAVar3 = Aig_ManConst1(pMan_local);
    pAVar4 = Aig_ManConst1(pMan);
    (pAVar4->field_5).pData = pAVar3;
    for (local_3c = 0; iVar1 = Vec_PtrSize(p), local_3c < iVar1; local_3c = local_3c + 1) {
      pAVar3 = (Aig_Obj_t *)Vec_PtrEntry(p,local_3c);
      iVar1 = Aig_ObjIsCi(pAVar3);
      if (iVar1 != 0) {
        pAVar4 = Aig_ObjCreateCi(pMan_local);
        (pAVar3->field_5).pData = pAVar4;
      }
    }
    for (local_3c = 0; iVar1 = Vec_PtrSize(p), local_3c < iVar1; local_3c = local_3c + 1) {
      pAVar3 = (Aig_Obj_t *)Vec_PtrEntry(p,local_3c);
      iVar1 = Aig_ObjIsNode(pAVar3);
      if (iVar1 != 0) {
        pAVar4 = Aig_ObjChild0Copy(pAVar3);
        p1 = Aig_ObjChild1Copy(pAVar3);
        pAVar4 = Aig_And(pMan_local,pAVar4,p1);
        (pAVar3->field_5).pData = pAVar4;
      }
    }
    for (local_3c = 0; iVar1 = Vec_PtrSize(vArray), local_3c < iVar1; local_3c = local_3c + 1) {
      pvVar5 = Vec_PtrEntry(vArray,local_3c);
      Aig_ObjCreateCo(pMan_local,*(Aig_Obj_t **)((long)pvVar5 + 0x28));
    }
    Aig_ManSetRegNum(pMan_local,0);
    Vec_PtrFree(p);
  }
  return pMan_local;
}

Assistant:

Aig_Man_t * Aig_ManDupNodes( Aig_Man_t * pMan, Vec_Ptr_t * vArray )
{
    Aig_Man_t * pNew;
    Vec_Ptr_t * vObjs;
    Aig_Obj_t * pObj = NULL;
    int i;
    if ( Vec_PtrSize(vArray) == 0 )
        return NULL;
    vObjs = Aig_ManDfsNodes( pMan, (Aig_Obj_t **)Vec_PtrArray(vArray), Vec_PtrSize(vArray) );
    // create the new manager
    pNew = Aig_ManStart( 10000 );
    pNew->pName = Abc_UtilStrsav( pMan->pName );
    Aig_ManConst1(pMan)->pData = Aig_ManConst1(pNew);
    Vec_PtrForEachEntry( Aig_Obj_t *, vObjs, pObj, i )
        if ( Aig_ObjIsCi(pObj) )
            pObj->pData = Aig_ObjCreateCi(pNew);
    Vec_PtrForEachEntry( Aig_Obj_t *, vObjs, pObj, i )
        if ( Aig_ObjIsNode(pObj) )
            pObj->pData = Aig_And( pNew, Aig_ObjChild0Copy(pObj), Aig_ObjChild1Copy(pObj) );
    Vec_PtrForEachEntry( Aig_Obj_t *, vArray, pObj, i )
            Aig_ObjCreateCo( pNew, (Aig_Obj_t *)pObj->pData );
    Aig_ManSetRegNum( pNew, 0 );
    Vec_PtrFree( vObjs );
    return pNew;
}